

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError Pa_Initialize(void)

{
  uint uVar1;
  long lVar2;
  PaUtilHostApiRepresentation *pPVar3;
  int iVar4;
  PaUtilHostApiRepresentation **ppPVar5;
  long *plVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  if (initializationCount_ == 0) {
    PaUtil_InitializeClock();
    uVar12 = 0xffffffffffffffff;
    lVar9 = -0x100000000;
    plVar6 = (long *)&paHostApiInitializers;
    do {
      lVar9 = lVar9 + 0x100000000;
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
      lVar2 = *plVar6;
      plVar6 = plVar6 + 1;
    } while (lVar2 != 0);
    ppPVar5 = (PaUtilHostApiRepresentation **)PaUtil_AllocateMemory(lVar9 >> 0x1d);
    hostApis_ = ppPVar5;
    if (ppPVar5 == (PaUtilHostApiRepresentation **)0x0) {
      iVar4 = -0x2708;
LAB_00104c99:
      TerminateHostApis();
      return iVar4;
    }
    hostApisCount_ = 0;
    defaultHostApiIndex_ = -1;
    deviceCount_ = 0;
    uVar7 = 0;
    if ((int)uVar11 < 1) {
      uVar12 = uVar7;
    }
    iVar8 = 0;
    for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
      ppPVar5[(int)uVar7] = (PaUtilHostApiRepresentation *)0x0;
      iVar4 = (**(code **)(&paHostApiInitializers + uVar10 * 8))();
      ppPVar5 = hostApis_;
      if (iVar4 != 0) goto LAB_00104c99;
      uVar7 = (ulong)hostApisCount_;
      pPVar3 = hostApis_[uVar7];
      if (pPVar3 != (PaUtilHostApiRepresentation *)0x0) {
        iVar4 = (pPVar3->info).deviceCount;
        uVar11 = (pPVar3->info).defaultInputDevice;
        if (iVar4 <= (int)uVar11) {
          __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_front.c"
                        ,0xc4,"PaError InitializeHostApis(void)");
        }
        uVar1 = (pPVar3->info).defaultOutputDevice;
        if (iVar4 <= (int)uVar1) {
          __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_front.c"
                        ,0xc5,"PaError InitializeHostApis(void)");
        }
        if (defaultHostApiIndex_ == -1) {
          if ((uVar1 & uVar11) != 0xffffffff) {
            defaultHostApiIndex_ = hostApisCount_;
            goto LAB_00104c3e;
          }
          (pPVar3->privatePaFrontInfo).baseDeviceIndex = (long)iVar8;
        }
        else {
LAB_00104c3e:
          (pPVar3->privatePaFrontInfo).baseDeviceIndex = (long)iVar8;
          if (uVar11 != 0xffffffff) {
            (pPVar3->info).defaultInputDevice = uVar11 + iVar8;
          }
          if (uVar1 != 0xffffffff) {
            (pPVar3->info).defaultOutputDevice = uVar1 + iVar8;
          }
        }
        deviceCount_ = deviceCount_ + iVar4;
        iVar8 = iVar8 + iVar4;
        hostApisCount_ = hostApisCount_ + 1;
        uVar7 = (ulong)(uint)hostApisCount_;
      }
    }
    if (defaultHostApiIndex_ == -1) {
      defaultHostApiIndex_ = 0;
    }
    initializationCount_ = initializationCount_ + 1;
  }
  else {
    initializationCount_ = initializationCount_ + 1;
  }
  return 0;
}

Assistant:

PaError Pa_Initialize( void )
{
    PaError result;

    PA_LOGAPI_ENTER( "Pa_Initialize" );

    if( PA_IS_INITIALISED_ )
    {
        ++initializationCount_;
        result = paNoError;
    }
    else
    {
        PA_VALIDATE_TYPE_SIZES;
        PA_VALIDATE_ENDIANNESS;
        
        PaUtil_InitializeClock();
        PaUtil_ResetTraceMessages();

        result = InitializeHostApis();
        if( result == paNoError )
            ++initializationCount_;
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_Initialize", result );

    return result;
}